

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate.cpp
# Opt level: O3

void __thiscall
ktx::ValidationContext::warning<unsigned_int&,std::__cxx11::string,std::__cxx11::string>
          (ValidationContext *this,IssueWarning *issue,uint *args,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2)

{
  char *pcVar1;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  string_view fmt;
  string_view fmt_00;
  format_args args_00;
  format_args args_01;
  undefined1 local_b0 [8];
  _Alloc_hider local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  string local_88;
  ulong local_68 [2];
  pointer local_58;
  size_type sStack_50;
  pointer local_48;
  size_type sStack_40;
  
  this->numWarning = this->numWarning + 1;
  if (this->treatWarningsAsError == true) {
    this->returnCode = 3;
    local_b0[0] = error;
    local_b0._2_2_ = (issue->super_Issue).id;
    pcVar1 = (issue->super_Issue).message._M_str;
    local_a8._M_p = (pointer)&local_98;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_a8,pcVar1,pcVar1 + (issue->super_Issue).message._M_len);
    local_68[0] = (ulong)*args;
    local_58 = (args_1->_M_dataplus)._M_p;
    sStack_50 = args_1->_M_string_length;
    local_48 = (args_2->_M_dataplus)._M_p;
    sStack_40 = args_2->_M_string_length;
    fmt.size_ = 0xdd2;
    fmt.data_ = (char *)(issue->super_Issue).detailsFmt._M_len;
    args_00.field_1.values_ = in_R9.values_;
    args_00.desc_ = (unsigned_long_long)local_68;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_88,(v10 *)(issue->super_Issue).detailsFmt._M_str,fmt,args_00);
    if ((this->callback).super__Function_base._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    (*(this->callback)._M_invoker)((_Any_data *)&this->callback,(ValidationReport *)local_b0);
  }
  else {
    local_b0[0] = (issue->super_Issue).type;
    local_b0._2_2_ = (issue->super_Issue).id;
    pcVar1 = (issue->super_Issue).message._M_str;
    local_a8._M_p = (pointer)&local_98;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_a8,pcVar1,pcVar1 + (issue->super_Issue).message._M_len);
    local_68[0] = (ulong)*args;
    local_58 = (args_1->_M_dataplus)._M_p;
    sStack_50 = args_1->_M_string_length;
    local_48 = (args_2->_M_dataplus)._M_p;
    sStack_40 = args_2->_M_string_length;
    fmt_00.size_ = 0xdd2;
    fmt_00.data_ = (char *)(issue->super_Issue).detailsFmt._M_len;
    args_01.field_1.values_ = in_R9.values_;
    args_01.desc_ = (unsigned_long_long)local_68;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_88,(v10 *)(issue->super_Issue).detailsFmt._M_str,fmt_00,args_01);
    if ((this->callback).super__Function_base._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    (*(this->callback)._M_invoker)((_Any_data *)&this->callback,(ValidationReport *)local_b0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_p != &local_98) {
    operator_delete(local_a8._M_p,local_98._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void warning(const IssueWarning& issue, Args&&... args) {
        ++numWarning;
        if (treatWarningsAsError) {
            returnCode = +rc::INVALID_FILE;
            callback(ValidationReport{IssueType::error, issue.id, std::string{issue.message}, fmt::format(issue.detailsFmt, std::forward<Args>(args)...)});

        } else {
            callback(ValidationReport{issue.type, issue.id, std::string{issue.message}, fmt::format(issue.detailsFmt, std::forward<Args>(args)...)});
        }
    }